

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

bool __thiscall tsip::send_request_msg(tsip *this,_command_packet _cmd)

{
  size_t sVar1;
  size_t __n;
  long lVar2;
  undefined8 uStack_130;
  uchar buffer [256];
  
  buffer[0] = '\x10';
  for (__n = 2; __n - _cmd.raw.cmd_len != 2; __n = __n + 1) {
    buffer[__n - 1] = (&stack0x00000006)[__n];
  }
  (buffer + (__n - 1))[0] = '\x10';
  (buffer + (__n - 1))[1] = '\x03';
  uStack_130 = 0x1036b6;
  sVar1 = fwrite(buffer,1,__n,(FILE *)this->file);
  if (this->verbose != false) {
    uStack_130 = 0x1036d1;
    printf("Sending Request: ");
    for (lVar2 = 0; (ulong)_cmd.raw.cmd_len + 3 != lVar2; lVar2 = lVar2 + 1) {
      uStack_130 = 0x1036f3;
      printf(" %x",(ulong)buffer[lVar2]);
    }
    uStack_130 = 0x103700;
    putchar(10);
  }
  return (int)sVar1 == (int)__n;
}

Assistant:

bool tsip::send_request_msg(_command_packet _cmd) {

	unsigned char buffer[256];
	buffer[0] = DLE;
	int x = 1;
	for (int j=0; j < _cmd.raw.cmd_len; j++,x++){
		buffer[x] = _cmd.raw.data[j];
	}
	buffer[x] = DLE;
	buffer[x+1] = ETX;
	int byte_cnt = fwrite(buffer, 1, x+1, file);
	if (verbose) {
		printf("Sending Request: ");
		for (int k=0;k<=x+1;k++){printf(" %x",buffer[k]);}
		printf("\n");
	}

	return (byte_cnt == x+1 ? true : false);
}